

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::EnumValueOptions::SharedDtor(MessageLite *self)

{
  FeatureSet *this;
  FieldOptions_FeatureSupport *this_00;
  Arena *pAVar1;
  LogMessage *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  MessageLite *local_18;
  EnumValueOptions *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (EnumValueOptions *)self;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  pAVar1 = MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    this = (FeatureSet *)local_18[4]._internal_metadata_.ptr_;
    if (this != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(this);
      operator_delete(this,0x48);
    }
    this_00 = (FieldOptions_FeatureSupport *)local_18[5]._vptr_MessageLite;
    if (this_00 != (FieldOptions_FeatureSupport *)0x0) {
      FieldOptions_FeatureSupport::~FieldOptions_FeatureSupport(this_00);
      operator_delete(this_00,0x30);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"this_.GetArena() == nullptr");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
             ,0x2cd7,local_40._M_len,local_40._M_str);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

inline void EnumValueOptions::SharedDtor(MessageLite& self) {
  EnumValueOptions& this_ = static_cast<EnumValueOptions&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.features_;
  delete this_._impl_.feature_support_;
  this_._impl_.~Impl_();
}